

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyOptions.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<32,_151>::ResonanceRange::verifyOptions
               (bool NRO,int NAPS,int LRU,int LRF)

{
  undefined8 *puVar1;
  int args_1;
  char *pcVar2;
  
  if ((uint)NAPS < 2 || NRO) {
    if ((uint)NAPS < 3 || !NRO) {
      if (LRU == 0 && NRO) {
        pcVar2 = 
        "An energy dependent scattering radius is not allowed for the scattering radius only special case (LRU = 0, LRF = 0)"
        ;
      }
      else {
        if ((LRF != 7 || LRU != 1) || !NRO) {
          return;
        }
        pcVar2 = 
        "An energy dependent scattering radius is not allowed for a Limited R-matrix resonance range (LRU = 1, LRF = 7)"
        ;
      }
      tools::Log::error<char_const*>(pcVar2);
      pcVar2 = "NRO value: {}";
      NAPS = 1;
      goto LAB_0018284f;
    }
    tools::Log::error<char_const*>("Encountered illegal NAPS value");
    tools::Log::info<char_const*>
              (
              "NAPS is either 0, 1 or 2 when an energy dependent scattering radius is given (NRO = 1)"
              );
    args_1 = 1;
  }
  else {
    tools::Log::error<char_const*>("Encountered illegal NAPS value");
    tools::Log::info<char_const*>
              ("NAPS is either 0 or 1 when no energy dependent scattering radius is given (NRO = 0)"
              );
    args_1 = 0;
  }
  tools::Log::info<char_const*,int>("NRO value: {}",args_1);
  pcVar2 = "NAPS value: {}";
LAB_0018284f:
  tools::Log::info<char_const*,int>(pcVar2,NAPS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyOptions( bool NRO, int NAPS, int LRU, int LRF ) {

  if ( not NRO and ( ( NAPS < 0 ) or ( NAPS > 1 ) ) ) {

    Log::error( "Encountered illegal NAPS value" );
    Log::info( "NAPS is either 0 or 1 when no energy dependent scattering "
               "radius is given (NRO = 0)" );
    Log::info( "NRO value: {}", int( NRO ) );
    Log::info( "NAPS value: {}", NAPS );
    throw std::exception();
  }

  if ( NRO and ( ( NAPS < 0 ) or ( NAPS > 2 ) ) ) {

    Log::error( "Encountered illegal NAPS value" );
    Log::info( "NAPS is either 0, 1 or 2 when an energy dependent scattering "
               "radius is given (NRO = 1)" );
    Log::info( "NRO value: {}", int( NRO ) );
    Log::info( "NAPS value: {}", NAPS );
    throw std::exception();
  }

  if ( NRO and ( LRU == 0 ) ) {

    Log::error( "An energy dependent scattering radius is not allowed for "
                "the scattering radius only special case (LRU = 0, LRF = 0)" );
    Log::info( "NRO value: {}", int( NRO ) );
    throw std::exception();
  }

  if ( NRO and ( LRU == 1 ) and ( LRF == 7 ) ) {

    Log::error( "An energy dependent scattering radius is not allowed for "
                "a Limited R-matrix resonance range (LRU = 1, LRF = 7)" );
    Log::info( "NRO value: {}", int( NRO ) );
    throw std::exception();
  }
}